

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryUriComponent
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,long param_3,
          uint param_4)

{
  kj kVar1;
  uint uVar2;
  EncodingResult<kj::Array<unsigned_char>_> *pEVar3;
  bool bVar4;
  kj *pkVar5;
  size_t sVar6;
  kj *pkVar7;
  bool bVar8;
  bool bVar9;
  Vector<unsigned_char> result;
  Vector<unsigned_char> local_68;
  int local_40;
  undefined4 local_3c;
  EncodingResult<kj::Array<unsigned_char>_> *local_38;
  
  sVar6 = (ulong)(param_4 & 1) + param_3;
  bVar8 = false;
  local_68.builder.ptr =
       (uchar *)_::HeapArrayDisposer::allocateImpl
                          (1,0,sVar6,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_68.builder.endPtr = (uchar *)((kj *)local_68.builder.ptr + sVar6);
  local_68.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.builder.pos = local_68.builder.ptr;
  if (0 < param_3) {
    pkVar5 = this + param_3;
    bVar4 = false;
    bVar8 = false;
    pEVar3 = __return_storage_ptr__;
    local_38 = __return_storage_ptr__;
    do {
      if (*this == (kj)0x25) {
        pkVar7 = this + 1;
        if (pkVar7 != pkVar5) {
          kVar1 = *pkVar7;
          if ((byte)((char)kVar1 - 0x30U) < 10) {
            local_40 = (byte)kVar1 - 0x30;
LAB_002baddd:
            bVar8 = true;
          }
          else {
            if ((byte)((char)kVar1 + 0x9fU) < 6) {
              local_40 = (byte)kVar1 - 0x57;
              goto LAB_002baddd;
            }
            bVar8 = (byte)((char)kVar1 + 0xbfU) < 6;
            if (bVar8) {
              local_40 = (byte)kVar1 - 0x37;
            }
          }
          if (bVar8) {
            pkVar7 = this + 2;
            if (pkVar7 == pkVar5) {
              bVar8 = true;
              kVar1 = SUB41(local_40,0);
            }
            else {
              kVar1 = *pkVar7;
              if ((byte)((char)kVar1 - 0x30U) < 10) {
                uVar2 = (byte)kVar1 - 0x30;
LAB_002bae33:
                bVar9 = true;
LAB_002bae35:
                pEVar3 = (EncodingResult<kj::Array<unsigned_char>_> *)(ulong)uVar2;
              }
              else {
                if ((byte)((char)kVar1 + 0x9fU) < 6) {
                  uVar2 = (byte)kVar1 - 0x57;
                  goto LAB_002bae33;
                }
                bVar9 = (byte)((char)kVar1 + 0xbfU) < 6;
                if (bVar9) {
                  uVar2 = (byte)kVar1 - 0x37;
                  goto LAB_002bae35;
                }
              }
              if (bVar9) {
                local_3c = SUB84(pEVar3,0);
                pkVar7 = this + 3;
              }
              kVar1 = (kj)((byte)(local_40 << 4) | (byte)local_3c);
              bVar8 = bVar4;
              if (!bVar9) {
                bVar8 = true;
                kVar1 = SUB41(local_40,0);
              }
            }
            if (local_68.builder.pos == local_68.builder.endPtr) {
              sVar6 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
              if (local_68.builder.endPtr == local_68.builder.ptr) {
                sVar6 = 4;
              }
              Vector<unsigned_char>::setCapacity(&local_68,sVar6);
            }
            *local_68.builder.pos = (RemoveConst<unsigned_char>)kVar1;
            local_68.builder.pos = local_68.builder.pos + 1;
            this = pkVar7;
            bVar4 = bVar8;
            goto LAB_002baea8;
          }
        }
        bVar4 = true;
        bVar8 = true;
        this = pkVar7;
      }
      else {
        if (((param_4 >> 8 & 1) == 0) || (*this != (kj)0x2b)) {
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar6 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar6 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_68,sVar6);
          }
          *local_68.builder.pos = (RemoveConst<unsigned_char>)*this;
        }
        else {
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar6 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar6 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_68,sVar6);
          }
          *local_68.builder.pos = ' ';
        }
        local_68.builder.pos = (RemoveConst<unsigned_char> *)((kj *)local_68.builder.pos + 1);
        this = this + 1;
      }
LAB_002baea8:
      __return_storage_ptr__ = local_38;
    } while (this < pkVar5);
  }
  if ((param_4 & 1) != 0) {
    if (local_68.builder.pos == local_68.builder.endPtr) {
      sVar6 = 4;
      if (local_68.builder.endPtr != local_68.builder.ptr) {
        sVar6 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
      }
      Vector<unsigned_char>::setCapacity(&local_68,sVar6);
    }
    *local_68.builder.pos = '\0';
    local_68.builder.pos = local_68.builder.pos + 1;
  }
  if (local_68.builder.pos != local_68.builder.endPtr) {
    Vector<unsigned_char>::setCapacity
              (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
  }
  (__return_storage_ptr__->super_Array<unsigned_char>).ptr = local_68.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).size_ =
       (long)local_68.builder.pos - (long)local_68.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).disposer = local_68.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar8;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryUriComponent(
    ArrayPtr<const char> text, DecodeUriOptions options) {
  Vector<byte> result(text.size() + options.nulTerminate);
  bool hadErrors = false;

  const char* ptr = text.begin();
  const char* end = text.end();
  while (ptr < end) {
    if (*ptr == '%') {
      ++ptr;

      if (ptr == end) {
        hadErrors = true;
      } else KJ_IF_MAYBE(d1, tryFromHexDigit(*ptr)) {
        byte b = *d1;
        ++ptr;
        if (ptr == end) {
          hadErrors = true;
        } else KJ_IF_MAYBE(d2, tryFromHexDigit(*ptr)) {
          b = (b << 4) | *d2;
          ++ptr;
        } else {
          hadErrors = true;
        }
        result.add(b);
      } else {
        hadErrors = true;
      }
    } else if (options.plusToSpace && *ptr == '+') {
      ++ptr;
      result.add(' ');
    } else {
      result.add(*ptr++);
    }
  }